

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping.cpp
# Opt level: O2

void test_2d_static<1ul,1ul,30ul,30ul>(void)

{
  int j_2;
  int j;
  long lVar1;
  unsigned_long *puVar2;
  long lVar3;
  int j_1;
  int *t;
  unsigned_long *local_e68;
  value_type true_idx;
  unsigned_long *local_e58;
  int *local_e50;
  int dptr [900];
  
  dptr[0]._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xb7,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",(bool *)dptr,
             (bool *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xb9,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xba,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 900;
  dptr[1] = 0;
  true_idx = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xbc,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,&true_idx);
  dptr[0] = 900;
  dptr[1] = 0;
  true_idx = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xbd,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,&true_idx);
  dptr[0]._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc3,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",(bool *)dptr,
             (bool *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc5,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","M",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc6,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,&true_idx);
  dptr[0] = 900;
  dptr[1] = 0;
  true_idx = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / N) * (Y / M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,200,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,&true_idx);
  dptr[0] = 900;
  dptr[1] = 0;
  true_idx = 900;
  puVar2 = (unsigned_long *)dptr;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc9,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",puVar2,&true_idx);
  for (lVar1 = 0; lVar1 != 0x1e; lVar1 = lVar1 + 1) {
    local_e58 = puVar2;
    for (lVar3 = 0; lVar3 != 900; lVar3 = lVar3 + 0x1e) {
      local_e68 = (unsigned_long *)(lVar1 + lVar3);
      true_idx = (value_type)local_e68;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xd3,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_e68,&true_idx);
      local_e50 = dptr + true_idx;
      local_e68 = puVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xd5,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (int **)&local_e68,&local_e50);
      *(undefined4 *)puVar2 = 0x2a;
      local_e68 = (unsigned_long *)CONCAT44(local_e68._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xd9,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",(int *)puVar2,
                 (int *)&local_e68);
      puVar2 = puVar2 + 0xf;
    }
    puVar2 = (unsigned_long *)((long)local_e58 + 4);
  }
  puVar2 = (unsigned_long *)dptr;
  for (lVar1 = 0; lVar1 != 0x1e; lVar1 = lVar1 + 1) {
    local_e58 = puVar2;
    for (lVar3 = 0; lVar3 != 900; lVar3 = lVar3 + 0x1e) {
      local_e68 = (unsigned_long *)(lVar1 + lVar3);
      true_idx = (value_type)local_e68;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xe3,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_e68,&true_idx);
      local_e50 = dptr + true_idx;
      local_e68 = puVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xe5,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (int **)&local_e68,&local_e50);
      *(int *)puVar2 = 0x11;
      local_e68 = (unsigned_long *)CONCAT44(local_e68._4_4_,0x11);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xe9,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",(int *)puVar2,
                 (int *)&local_e68);
      puVar2 = puVar2 + 0xf;
    }
    puVar2 = (unsigned_long *)((long)local_e58 + 4);
  }
  t = dptr;
  for (lVar1 = 0; lVar1 != 0x1e; lVar1 = lVar1 + 1) {
    local_e58 = (unsigned_long *)t;
    for (lVar3 = 0; lVar3 != 900; lVar3 = lVar3 + 0x1e) {
      local_e68 = (unsigned_long *)(lVar3 + lVar1);
      true_idx = (value_type)local_e68;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xf2,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_e68,&true_idx);
      local_e68 = (unsigned_long *)CONCAT44(local_e68._4_4_,0x11);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xf9,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",t,
                 (int *)&local_e68);
      t = t + 0x1e;
    }
    t = (int *)((long)local_e58 + 4);
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");
    static_assert(0 == (Y % M), "Y must be divisable by M");

    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<0, 0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    layout_mapping_right<
        dimensions<X / N, Y / M>, dimensions<N, M>, dimensions<0, 0> 
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);
    BOOST_TEST_EQ((sub_l.stride(1)), M);

    BOOST_TEST_EQ((sub_l.size()), (X / N) * (Y / M));
    BOOST_TEST_EQ((sub_l.span()), X * Y);

    int dptr[X * Y];

    // Set all elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set every (Nth, Mth) element to 17.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.stepping();
        auto const true_idx = (sub_l[1] * s[1]) * (s[0] * i) + (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 17);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // Element in the strided sub-box.
        if (  (0 == (i % sub_l.stepping()[0]))
           && (0 == (j % sub_l.stepping()[1]))
           )
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}